

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>
fmt::v8::detail::
write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,char_const*,fmt::v8::detail::digit_grouping<char8_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out,char *significand,
          int significand_size,int integral_size,char8_t decimal_point,
          digit_grouping<char8_t> *grouping)

{
  char8_t cVar1;
  type tVar2;
  char8_t *pcVar3;
  char8_t *end;
  basic_string_view<char8_t> local_298;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> local_288;
  buffer<char8_t> *local_280;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> local_278 [3];
  allocator<char8_t> local_259;
  undefined1 local_258 [8];
  basic_memory_buffer<char8_t,_500UL,_std::allocator<char8_t>_> buffer;
  digit_grouping<char8_t> *grouping_local;
  char8_t decimal_point_local;
  int integral_size_local;
  int significand_size_local;
  char *significand_local;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out_local;
  
  cVar1 = digit_grouping<char8_t>::separator(grouping);
  if (cVar1 == '\0') {
    buffer._528_8_ = out.container;
    out_local = write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>
                          (out,significand,significand_size,integral_size,decimal_point);
  }
  else {
    std::allocator<char8_t>::allocator(&local_259);
    basic_memory_buffer<char8_t,_500UL,_std::allocator<char8_t>_>::basic_memory_buffer
              ((basic_memory_buffer<char8_t,_500UL,_std::allocator<char8_t>_> *)local_258,&local_259
              );
    std::allocator<char8_t>::~allocator(&local_259);
    std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>::back_insert_iterator
              (local_278,(buffer<char8_t> *)local_258);
    local_280 = (buffer<char8_t> *)
                write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>
                          (local_278[0],significand,significand_size,integral_size,decimal_point);
    local_288.container = out.container;
    pcVar3 = buffer<char8_t>::data((buffer<char8_t> *)local_258);
    tVar2 = to_unsigned<int>(integral_size);
    basic_string_view<char8_t>::basic_string_view(&local_298,pcVar3,(ulong)tVar2);
    digit_grouping<char8_t>::
    apply<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>
              (grouping,local_288,local_298);
    pcVar3 = buffer<char8_t>::data((buffer<char8_t> *)local_258);
    end = buffer<char8_t>::end((buffer<char8_t> *)local_258);
    out_local = copy_str_noinline<char8_t,char8_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                          (pcVar3 + integral_size,end,out);
    basic_memory_buffer<char8_t,_500UL,_std::allocator<char8_t>_>::~basic_memory_buffer
              ((basic_memory_buffer<char8_t,_500UL,_std::allocator<char8_t>_> *)local_258);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)out_local.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}